

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  void *pvVar7;
  pointer pcVar8;
  undefined8 uVar9;
  SPIRVariable *pSVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  ulong uVar14;
  Resource *pRVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  long lVar18;
  Resource *pRVar19;
  ulong uVar20;
  size_t i;
  ulong uVar21;
  
  uVar20 = (this->super_VectorView<Resource>).buffer_size;
  uVar21 = uVar20 + 1;
  if (uVar21 >> 0x3a == 0) {
    uVar16 = this->buffer_capacity;
    if (uVar16 < uVar21) {
      uVar14 = 8;
      if (8 < uVar16) {
        uVar14 = uVar16;
      }
      do {
        uVar16 = uVar14;
        uVar14 = uVar16 * 2;
      } while (uVar16 < uVar21);
      if (uVar16 < 9) {
        pRVar15 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar15 = (Resource *)malloc(uVar16 << 6);
        if (pRVar15 == (Resource *)0x0) goto LAB_002d67a1;
      }
      pRVar19 = (this->super_VectorView<Resource>).ptr;
      if ((uVar20 != 0) && (pRVar15 != pRVar19)) {
        lVar18 = 0x20;
        uVar21 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pRVar15->var + lVar18);
          pRVar19 = (this->super_VectorView<Resource>).ptr;
          puVar4 = (undefined8 *)((long)&pRVar19->var + lVar18);
          puVar5 = (undefined8 *)((long)pRVar19 + lVar18 + -0x20);
          uVar9 = puVar5[1];
          puVar6 = (undefined8 *)((long)pRVar15 + lVar18 + -0x20);
          *puVar6 = *puVar5;
          puVar6[1] = uVar9;
          *(undefined8 **)((long)pRVar15 + lVar18 + -0x10) = puVar3;
          puVar5 = *(undefined8 **)((long)pRVar19 + lVar18 + -0x10);
          if (puVar4 == puVar5) {
            uVar9 = puVar4[1];
            *puVar3 = *puVar4;
            puVar3[1] = uVar9;
          }
          else {
            *(undefined8 **)((long)pRVar15 + lVar18 + -0x10) = puVar5;
            *(undefined8 *)((long)&pRVar15->var + lVar18) = *puVar4;
          }
          *(undefined8 *)((long)pRVar15 + lVar18 + -8) =
               *(undefined8 *)((long)pRVar19 + lVar18 + -8);
          *(undefined8 **)((long)pRVar19 + lVar18 + -0x10) = puVar4;
          *(undefined8 *)((long)pRVar19 + lVar18 + -8) = 0;
          *(undefined1 *)((long)&pRVar19->var + lVar18) = 0;
          puVar3 = (undefined8 *)((long)&(pRVar19->name)._M_dataplus._M_p + lVar18);
          uVar9 = puVar3[1];
          puVar4 = (undefined8 *)((long)&(pRVar15->name)._M_dataplus._M_p + lVar18);
          *puVar4 = *puVar3;
          puVar4[1] = uVar9;
          pRVar19 = (this->super_VectorView<Resource>).ptr;
          pvVar7 = *(void **)((long)pRVar19 + lVar18 + -0x10);
          if ((void *)((long)&pRVar19->var + lVar18) != pvVar7) {
            operator_delete(pvVar7);
          }
          uVar21 = uVar21 + 1;
          uVar20 = (this->super_VectorView<Resource>).buffer_size;
          lVar18 = lVar18 + 0x40;
        } while (uVar21 < uVar20);
        pRVar19 = (this->super_VectorView<Resource>).ptr;
      }
      if (pRVar19 != (Resource *)&this->stack_storage) {
        free(pRVar19);
        uVar20 = (this->super_VectorView<Resource>).buffer_size;
      }
      (this->super_VectorView<Resource>).ptr = pRVar15;
      this->buffer_capacity = uVar16;
    }
    else {
      pRVar15 = (this->super_VectorView<Resource>).ptr;
    }
    pSVar10 = t->descriptor_alias;
    pRVar19 = pRVar15 + uVar20;
    paVar17 = &(pRVar19->name).field_2;
    pRVar19->var = t->var;
    pRVar19->descriptor_alias = pSVar10;
    (pRVar19->name)._M_dataplus._M_p = (pointer)paVar17;
    pcVar8 = (t->name)._M_dataplus._M_p;
    paVar1 = &(t->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 == paVar1) {
      uVar9 = *(undefined8 *)((long)&(t->name).field_2 + 8);
      paVar17->_M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&(pRVar19->name).field_2 + 8) = uVar9;
    }
    else {
      pRVar15[uVar20].name._M_dataplus._M_p = pcVar8;
      pRVar15[uVar20].name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    pRVar15[uVar20].name._M_string_length = (t->name)._M_string_length;
    (t->name)._M_dataplus._M_p = (pointer)paVar1;
    (t->name)._M_string_length = 0;
    (t->name).field_2._M_local_buf[0] = '\0';
    uVar11 = t->index;
    uVar12 = t->plane;
    uVar13 = t->secondary_index;
    pRVar15[uVar20].basetype = t->basetype;
    pRVar15[uVar20].index = uVar11;
    pRVar15[uVar20].plane = uVar12;
    pRVar15[uVar20].secondary_index = uVar13;
    psVar2 = &(this->super_VectorView<Resource>).buffer_size;
    *psVar2 = *psVar2 + 1;
    return;
  }
LAB_002d67a1:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}